

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::VariableP<tcu::Vector<int,_2>_>::VariableP
          (VariableP<tcu::Vector<int,_2>_> *this,Variable<tcu::Vector<int,_2>_> *ptr)

{
  Variable<tcu::Vector<int,_2>_> *ptr_local;
  VariableP<tcu::Vector<int,_2>_> *this_local;
  
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>::SharedPtr
            (&this->super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>,ptr)
  ;
  return;
}

Assistant:

explicit	VariableP	(const Variable<T>* ptr) : Super(ptr) {}